

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

void __thiscall FPTest_ComputeBoundaries_Test::TestBody(FPTest_ComputeBoundaries_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  fp upper;
  fp lower;
  fp v;
  AssertHelper *in_stack_fffffffffffffea0;
  unsigned_long *in_stack_fffffffffffffea8;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  char *in_stack_fffffffffffffeb8;
  int line;
  fp *in_stack_fffffffffffffec0;
  AssertionResult *this_02;
  undefined4 in_stack_fffffffffffffec8;
  Type in_stack_fffffffffffffecc;
  Type type;
  fp *in_stack_fffffffffffffed0;
  Message *in_stack_ffffffffffffff18;
  AssertHelper *in_stack_ffffffffffffff20;
  AssertionResult local_d0 [2];
  undefined8 local_b0;
  AssertionResult local_a8 [2];
  undefined4 local_84;
  AssertionResult local_80 [3];
  undefined8 local_50;
  AssertionResult local_48;
  fp local_38;
  fp local_28;
  fp local_18;
  
  fmt::v5::internal::fp::fp(&local_18,0x10000000000000,0x2a);
  fmt::v5::internal::fp::fp(&local_28);
  fmt::v5::internal::fp::fp(&local_38);
  fmt::v5::internal::fp::compute_boundaries
            (in_stack_fffffffffffffed0,
             (fp *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec0);
  local_50 = 0x7ffffffffffffe00;
  testing::internal::EqHelper<false>::Compare<long,unsigned_long>
            (in_stack_fffffffffffffeb8,
             (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             (long *)in_stack_fffffffffffffea8,(unsigned_long *)in_stack_fffffffffffffea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffed0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10f2db);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x10f338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f38d);
  local_84 = 0x1f;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffeb8,
             (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             (int *)in_stack_fffffffffffffea8,(int *)in_stack_fffffffffffffea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffed0);
    in_stack_fffffffffffffed0 =
         (fp *)testing::AssertionResult::failure_message((AssertionResult *)0x10f42e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x10f48b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f4e0);
  local_b0 = 0x8000000000000400;
  this_02 = local_a8;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffeb8,
             (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8,(unsigned_long *)in_stack_fffffffffffffea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffecc);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffed0);
    in_stack_fffffffffffffeb8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10f588);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffed0,type,&this_02->success_,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x10f5e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f63a);
  this_01 = local_d0;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffeb8,
             (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),(int *)this_01,
             (int *)in_stack_fffffffffffffea0);
  line = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffed0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10f6db)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffed0,type,&this_02->success_,line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffeb0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x10f738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f78d);
  return;
}

Assistant:

TEST(FPTest, ComputeBoundaries) {
  auto v = fp(0x10000000000000, 42);
  fp lower, upper;
  v.compute_boundaries(lower, upper);
  EXPECT_EQ(0x7ffffffffffffe00, lower.f);
  EXPECT_EQ(31, lower.e);
  EXPECT_EQ(0x8000000000000400, upper.f);
  EXPECT_EQ(31, upper.e);
}